

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

VectorNd __thiscall HermiteSpline<3U,_1U>::interpolate(HermiteSpline<3U,_1U> *this,double s)

{
  reference pvVar1;
  size_type sVar2;
  vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_> *in_RSI;
  UnitBoundedPolynomial<3U,_1U> *in_RDI;
  bool bVar3;
  double in_XMM0_Qa;
  VectorNd VVar4;
  double s_;
  int m;
  UnitBoundedPolynomial<3U,_1U> *this_00;
  double local_28;
  
  this_00 = in_RDI;
  local_28 = in_XMM0_Qa;
  while( true ) {
    pvVar1 = std::
             vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
             ::operator[](in_RSI,0);
    bVar3 = false;
    if (pvVar1->length <= local_28 && local_28 != pvVar1->length) {
      sVar2 = std::
              vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
              ::size(in_RSI);
      bVar3 = sVar2 != 0;
    }
    if (!bVar3) break;
    pvVar1 = std::
             vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
             ::operator[](in_RSI,0);
    local_28 = local_28 - pvVar1->length;
  }
  std::vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>::
  operator[](in_RSI,0);
  std::vector<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>::
  operator[](in_RSI,0);
  VVar4 = UnitBoundedPolynomial<3U,_1U>::interpolate(this_00,(double)in_RDI);
  return (VectorNd)
         VVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
         [0];
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}